

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O3

void run_command(uint8_t command)

{
  rtc_t *rtc;
  gbabus_t *pgVar1;
  rtc_state_t rVar2;
  char *pcVar3;
  
  pgVar1 = bus;
  if (2 < gba_log_verbosity) {
    pcVar3 = "Read";
    if (command < 8) {
      pcVar3 = "Writ";
    }
    printf("[DEBUG] [GPIO] [RTC] %sing register: 0x%X\n",pcVar3,(ulong)(command & 7));
  }
  rtc = &pgVar1->rtc;
  (pgVar1->rtc).reg = command & 7;
  if (command < 8) {
    write_register(rtc);
    rVar2 = RTC_DATA_WRITE;
  }
  else {
    read_register(rtc);
    rVar2 = RTC_DATA_READ;
  }
  rtc->state = rVar2;
  return;
}

Assistant:

void run_command(byte command) {
    rtc_t* rtc = &bus->rtc;
    bool read = command >> 3;
    byte reg = command & 0x7;

    logdebug("[GPIO] [RTC] %sing register: 0x%X", read ? "Read" : "Writ", reg);

    rtc->reg = reg;

    if (read) {
        read_register(rtc);
        rtc->state = RTC_DATA_READ;
    } else {
        write_register(rtc);
        rtc->state = RTC_DATA_WRITE;
    }
}